

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O1

void __thiscall YdiskRestClient::deleteFromTrash(YdiskRestClient *this,string *utf8Path)

{
  undefined8 extraout_RAX;
  char *this_00;
  YdiskRestClient *this_01;
  shared_ptr<httplib::Response> r;
  string url;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  _Base_ptr local_28 [2];
  
  this_01 = (YdiskRestClient *)local_58;
  this_00 = "/v1/disk/trash/resources?path=";
  local_38._M_allocated_capacity = (size_type)(Headers *)local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_48 + 0x10),"/v1/disk/trash/resources?path=","");
  url_encode((string *)local_58,(YdiskRestClient *)this_00,utf8Path);
  std::__cxx11::string::_M_append(local_48 + 0x10,local_58._0_8_);
  if ((Response *)local_58._0_8_ != (Response *)local_48) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
  }
  httplib::Client::Delete
            ((Client *)local_58,(char *)this->http_client,(Headers *)local_38._M_allocated_capacity)
  ;
  if ((Response *)local_58._0_8_ != (Response *)0x0) {
    if (*(int *)(local_58._0_8_ + 0x20) != 0xcc) {
      if (((Response *)local_58._0_8_ == (Response *)0x0) ||
         (*(int *)(local_58._0_8_ + 0x20) != 0xca)) goto LAB_0014104c;
      wait_success_operation(this,(string *)(local_58._0_8_ + 0x58));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    if ((Headers *)local_38._M_allocated_capacity != (Headers *)local_28) {
      operator_delete((void *)local_38._M_allocated_capacity,
                      (ulong)((long)&local_28[0]->_M_color + 1));
    }
    return;
  }
LAB_0014104c:
  throw_response_error(this_01,(Response *)local_58._0_8_);
  if ((Headers *)local_38._M_allocated_capacity != (Headers *)local_28) {
    operator_delete((void *)local_38._M_allocated_capacity,(ulong)((long)&local_28[0]->_M_color + 1)
                   );
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::deleteFromTrash(std::string utf8Path)
{
    std::string url("/v1/disk/trash/resources?path=");
    url += url_encode(utf8Path);
    auto r = http_client->Delete(url.c_str(), headers);

    if(r.get() && r->status==204){
        return;
    } else if(r.get() && r->status==202){
        //not empty folder is removing, get operation status
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}